

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strparse.c
# Opt level: O0

int Curl_str_untilnl(char **linep,Curl_str *out,size_t max)

{
  bool bVar1;
  ulong local_38;
  size_t len;
  char *s;
  size_t max_local;
  Curl_str *out_local;
  char **linep_local;
  
  len = (size_t)*linep;
  local_38 = 0;
  Curl_str_init(out);
  while( true ) {
    bVar1 = false;
    if (*(char *)len != '\0') {
      bVar1 = true;
      if (*(char *)len != '\n') {
        bVar1 = *(char *)len == '\r';
      }
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (!bVar1) break;
    len = len + 1;
    local_38 = local_38 + 1;
    if (max < local_38) {
      return 1;
    }
  }
  if (local_38 == 0) {
    return 2;
  }
  out->str = *linep;
  out->len = local_38;
  *linep = (char *)len;
  return 0;
}

Assistant:

int Curl_str_untilnl(const char **linep, struct Curl_str *out,
                     const size_t max)
{
  const char *s = *linep;
  size_t len = 0;
  DEBUGASSERT(linep && *linep && out && max);

  Curl_str_init(out);
  while(*s && !ISNEWLINE(*s)) {
    s++;
    if(++len > max)
      return STRE_BIG;
  }
  if(!len)
    return STRE_SHORT;
  out->str = *linep;
  out->len = len;
  *linep = s; /* point to the first byte after the word */
  return STRE_OK;
}